

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

char * gl4cts::TextureViewUtilities::getGLSLDataTypeForSamplerType
                 (_sampler_type sampler_type,uint n_components)

{
  ulong uVar1;
  TestError *this;
  undefined *puVar2;
  
  if (sampler_type == SAMPLER_TYPE_UNSIGNED_INTEGER) {
    if (n_components - 1 < 4) {
      uVar1 = (ulong)(n_components - 1);
      puVar2 = &DAT_01dda830;
LAB_00aa9a06:
      return *(char **)(puVar2 + uVar1 * 8);
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unsupported number of components",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x47e);
  }
  else if (sampler_type == SAMPLER_TYPE_SIGNED_INTEGER) {
    if (n_components - 1 < 4) {
      uVar1 = (ulong)(n_components - 1);
      puVar2 = &DAT_01dda810;
      goto LAB_00aa9a06;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unsupported number of components",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x464);
  }
  else if (sampler_type == SAMPLER_TYPE_FLOAT) {
    if (n_components - 1 < 4) {
      uVar1 = (ulong)(n_components - 1);
      puVar2 = &DAT_01dda7f0;
      goto LAB_00aa9a06;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unsupported number of components",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x44a);
  }
  else {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized sampler type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x487);
  }
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const char* TextureViewUtilities::getGLSLDataTypeForSamplerType(const _sampler_type sampler_type,
																const unsigned int  n_components)
{
	const char* result = "";

	switch (sampler_type)
	{
	case SAMPLER_TYPE_FLOAT:
	{
		switch (n_components)
		{
		case 1:
			result = "float";
			break;
		case 2:
			result = "vec2";
			break;
		case 3:
			result = "vec3";
			break;
		case 4:
			result = "vec4";
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components");
		}
		} /* switch (n_components) */

		break;
	}

	case SAMPLER_TYPE_SIGNED_INTEGER:
	{
		switch (n_components)
		{
		case 1:
			result = "int";
			break;
		case 2:
			result = "ivec2";
			break;
		case 3:
			result = "ivec3";
			break;
		case 4:
			result = "ivec4";
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components");
		}
		} /* switch (n_components) */

		break;
	}

	case SAMPLER_TYPE_UNSIGNED_INTEGER:
	{
		switch (n_components)
		{
		case 1:
			result = "uint";
			break;
		case 2:
			result = "uvec2";
			break;
		case 3:
			result = "uvec3";
			break;
		case 4:
			result = "uvec4";
			break;

		default:
		{
			TCU_FAIL("Unsupported number of components");
		}
		} /* switch (n_components) */

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized sampler type");
	}
	} /* switch (sampler_type) */

	return result;
}